

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_wrapper.cpp
# Opt level: O2

void __thiscall
duckdb::ResultArrowArrayStreamWrapper::ResultArrowArrayStreamWrapper
          (ResultArrowArrayStreamWrapper *this,
          unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *result_p,
          idx_t batch_size_p)

{
  unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *this_00;
  type args;
  pointer pQVar1;
  ClientContext *context;
  runtime_error *this_01;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  this_00 = &this->result;
  (this->result).super_unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>.
  _M_t.super___uniq_ptr_impl<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>.
  super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl =
       (result_p->super_unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>).
       _M_t.super___uniq_ptr_impl<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>
       .super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl;
  (result_p->super_unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)._M_t.
  super___uniq_ptr_impl<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>.
  super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl = (QueryResult *)0x0;
  ErrorData::ErrorData(&this->last_error);
  (this->column_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->column_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->column_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->column_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->column_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->column_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  args = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::operator*
                   (this_00);
  make_uniq<duckdb::QueryResultChunkScanState,duckdb::QueryResult&>((duckdb *)&local_68,args);
  (this->scan_state).
  super_unique_ptr<duckdb::ChunkScanState,_std::default_delete<duckdb::ChunkScanState>_>._M_t.
  super___uniq_ptr_impl<duckdb::ChunkScanState,_std::default_delete<duckdb::ChunkScanState>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ChunkScanState_*,_std::default_delete<duckdb::ChunkScanState>_>.
  super__Head_base<0UL,_duckdb::ChunkScanState_*,_false>._M_head_impl =
       (ChunkScanState *)local_68._M_buckets;
  (this->extension_types)._M_h._M_buckets = &(this->extension_types)._M_h._M_single_bucket;
  (this->extension_types)._M_h._M_bucket_count = 1;
  (this->extension_types)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->extension_types)._M_h._M_element_count = 0;
  (this->extension_types)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->extension_types)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->extension_types)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->stream).private_data = this;
  if (batch_size_p != 0) {
    this->batch_size = batch_size_p;
    (this->stream).get_schema = MyStreamGetSchema;
    (this->stream).get_next = MyStreamGetNext;
    (this->stream).release = MyStreamRelease;
    (this->stream).get_last_error = MyStreamGetLastError;
    pQVar1 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
             operator->(this_00);
    context = optional_ptr<duckdb::ClientContext,_true>::operator*
                        (&(pQVar1->client_properties).client_context);
    pQVar1 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
             operator->(this_00);
    ArrowTypeExtensionData::GetExtensionTypes
              ((unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
                *)&local_68,context,&(pQVar1->super_BaseQueryResult).types);
    ::std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::operator=(&(this->extension_types)._M_h,&local_68);
    ::std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_68);
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error
            (this_01,"Approximate Batch Size of Record Batch MUST be higher than 0");
  __cxa_throw(this_01,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

ResultArrowArrayStreamWrapper::ResultArrowArrayStreamWrapper(unique_ptr<QueryResult> result_p, idx_t batch_size_p)
    : result(std::move(result_p)), scan_state(make_uniq<QueryResultChunkScanState>(*result)) {
	//! We first initialize the private data of the stream
	stream.private_data = this;
	//! Ceil Approx_Batch_Size/STANDARD_VECTOR_SIZE
	if (batch_size_p == 0) {
		throw std::runtime_error("Approximate Batch Size of Record Batch MUST be higher than 0");
	}
	batch_size = batch_size_p;
	//! We initialize the stream functions
	stream.get_schema = ResultArrowArrayStreamWrapper::MyStreamGetSchema;
	stream.get_next = ResultArrowArrayStreamWrapper::MyStreamGetNext;
	stream.release = ResultArrowArrayStreamWrapper::MyStreamRelease;
	stream.get_last_error = ResultArrowArrayStreamWrapper::MyStreamGetLastError;

	extension_types =
	    ArrowTypeExtensionData::GetExtensionTypes(*result->client_properties.client_context, result->types);
}